

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_spec.cpp
# Opt level: O0

bool __thiscall FParser::spec_elseif(FParser *this,bool lastif)

{
  int iVar1;
  char *pcVar2;
  bool ifresult;
  undefined1 local_38 [8];
  svalue_t eval;
  int endtoken;
  bool lastif_local;
  FParser *this_local;
  
  eval.value._7_1_ = lastif;
  svalue_t::svalue_t((svalue_t *)local_38);
  eval.value.i = FindOperator(this,0,this->NumTokens + -1,")");
  if (eval.value.i == -1) {
    script_error("parse error in elseif statement\n");
    this_local._7_1_ = false;
  }
  else if ((eval.value._7_1_ & 1) == 0) {
    EvaluateExpression(this,(svalue_t *)local_38,2,eval.value.i + -1);
    iVar1 = intvalue((svalue_t *)local_38);
    this_local._7_1_ = iVar1 != 0;
    if (((this->Section == (DFsSection *)0x0) || (this->BraceType != 0)) ||
       (eval.value.i != this->NumTokens + -1)) {
      if ((this_local._7_1_) && (eval.value.i != this->NumTokens + -1)) {
        EvaluateExpression(this,(svalue_t *)local_38,eval.value.i + 1,this->NumTokens + -1);
      }
    }
    else if (!this_local._7_1_) {
      pcVar2 = DFsScript::SectionEnd(this->Script,this->Section);
      this->Rover = pcVar2 + 1;
    }
  }
  else {
    pcVar2 = DFsScript::SectionEnd(this->Script,this->Section);
    this->Rover = pcVar2 + 1;
    this_local._7_1_ = true;
  }
  svalue_t::~svalue_t((svalue_t *)local_38);
  return this_local._7_1_;
}

Assistant:

bool FParser::spec_elseif(bool lastif)
{
	int endtoken;
	svalue_t eval;
	
	if((endtoken = FindOperator(0, NumTokens-1, ")")) == -1)
	{
		script_error("parse error in elseif statement\n");
		return false;
	}
	
	if(lastif)
	{
		Rover = Script->SectionEnd(Section) + 1;
		return true;
	}
	// 2 to skip past the 'elseif' and '('
	EvaluateExpression(eval, 2, endtoken-1);
	bool ifresult = !!intvalue(eval);
	
	if(Section && BraceType == bracket_open
		&& endtoken == NumTokens-1)
    {
		// {} braces
		if(!ifresult)       // skip to end of section
			Rover = Script->SectionEnd(Section) + 1;
    }
	else if(ifresult)    // elseif() without {} braces
	{
		// nothing to do ?
		if(endtoken != NumTokens-1)
			EvaluateExpression(eval, endtoken+1, NumTokens-1);
	}
	
	return ifresult;
}